

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O2

bool mxx::
     is_sorted<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxDistribution_StableBlockDistr_Test::TestBody()::__0>
               (int *begin,int *end,comm *param_3)

{
  int *piVar1;
  int *piVar2;
  pair<int,_int> pVar3;
  int *piVar4;
  bool bVar5;
  comm local_50;
  
  piVar4 = begin;
  if (begin != end) {
    piVar1 = begin + 2;
    do {
      piVar2 = piVar1;
      piVar4 = end;
      if (piVar2 == end) break;
      piVar1 = piVar2 + 2;
      piVar4 = piVar2;
    } while (piVar2[-2] <= *piVar2);
  }
  bVar5 = piVar4 == end;
  if (param_3->m_size != 1) {
    comm::comm(&local_50);
    pVar3 = right_shift<std::pair<int,int>>((pair<int,_int> *)(end + -2),&local_50);
    comm::~comm(&local_50);
    bVar5 = param_3->m_rank < 1 && piVar4 == end;
    if ((0 < param_3->m_rank) && (piVar4 == end)) {
      bVar5 = pVar3.first <= *begin;
    }
    bVar5 = all_of(bVar5,param_3);
  }
  return bVar5;
}

Assistant:

bool is_sorted(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm = mxx::comm()) {
    return impl::is_sorted(begin, end, comp, comm);
}